

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings.c
# Opt level: O1

_Bool gppmap(settings_r *sesskey,char *name,Conf *conf,int primary)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char cVar4;
  char *pcVar5;
  
  while (pcVar1 = conf_get_str_nthstrkey(conf,primary,0), pcVar1 != (char *)0x0) {
    conf_del_str_str(conf,primary,pcVar1);
  }
  pcVar1 = gpps_raw(sesskey,name,(char *)0x0);
  if (pcVar1 != (char *)0x0) {
    if (*pcVar1 != '\0') {
      pcVar2 = pcVar1;
      pcVar3 = (char *)0x0;
      pcVar5 = pcVar1;
      do {
        while ((cVar4 = *pcVar5, cVar4 != '\0' && (cVar4 != ','))) {
          if (cVar4 == '=') {
            cVar4 = '\0';
          }
          if (cVar4 == '\\') {
            cVar4 = pcVar5[1];
            pcVar5 = pcVar5 + 2;
          }
          else {
            pcVar5 = pcVar5 + 1;
          }
          *pcVar2 = cVar4;
          pcVar2 = pcVar2 + 1;
          if (cVar4 == '\0') {
            pcVar3 = pcVar2;
          }
        }
        if (pcVar3 == (char *)0x0) {
          pcVar3 = pcVar2;
        }
        *pcVar2 = '\0';
        if ((primary == 0xb0) && (pcVar2 = strchr(pcVar1,0x44), pcVar2 != (char *)0x0)) {
          pcVar2 = dupstr(pcVar1);
          pcVar3 = strchr(pcVar2,0x44);
          *pcVar3 = 'L';
          conf_set_str_str(conf,0xb0,pcVar2,"D");
          safefree(pcVar2);
        }
        else {
          conf_set_str_str(conf,primary,pcVar1,pcVar3);
        }
        pcVar5 = pcVar5 + (cVar4 == ',');
        pcVar2 = pcVar1;
        pcVar3 = (char *)0x0;
      } while (*pcVar5 != '\0');
    }
    safefree(pcVar1);
  }
  return pcVar1 != (char *)0x0;
}

Assistant:

static bool gppmap(settings_r *sesskey, const char *name,
                   Conf *conf, int primary)
{
    char *buf, *p, *q, *key, *val;

    /*
     * Start by clearing any existing subkeys of this key from conf.
     */
    while ((key = conf_get_str_nthstrkey(conf, primary, 0)) != NULL)
        conf_del_str_str(conf, primary, key);

    /*
     * Now read a serialised list from the settings and unmarshal it
     * into its components.
     */
    buf = gpps_raw(sesskey, name, NULL);
    if (!buf)
        return false;

    p = buf;
    while (*p) {
        q = buf;
        val = NULL;
        while (*p && *p != ',') {
            int c = *p++;
            if (c == '=')
                c = '\0';
            if (c == '\\')
                c = *p++;
            *q++ = c;
            if (!c)
                val = q;
        }
        if (*p == ',')
            p++;
        if (!val)
            val = q;
        *q = '\0';

        if (primary == CONF_portfwd && strchr(buf, 'D') != NULL) {
            /*
             * Backwards-compatibility hack: dynamic forwardings are
             * indexed in the data store as a third type letter in the
             * key, 'D' alongside 'L' and 'R' - but really, they
             * should be filed under 'L' with a special _value_,
             * because local and dynamic forwardings both involve
             * _listening_ on a local port, and are hence mutually
             * exclusive on the same port number. So here we translate
             * the legacy storage format into the sensible internal
             * form, by finding the D and turning it into a L.
             */
            char *newkey = dupstr(buf);
            *strchr(newkey, 'D') = 'L';
            conf_set_str_str(conf, primary, newkey, "D");
            sfree(newkey);
        } else {
            conf_set_str_str(conf, primary, buf, val);
        }
    }
    sfree(buf);

    return true;
}